

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.h
# Opt level: O3

string * __thiscall fs::path::utf8string_abi_cxx11_(string *__return_storage_ptr__,path *this)

{
  size_type sVar1;
  pointer pcVar2;
  long in_FS_OFFSET;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = (this->super_path)._M_pathname._M_string_length;
  if (sVar1 == 0) {
    local_38 = &local_28;
    local_30 = 0;
    local_28 = 0;
  }
  else {
    pcVar2 = (this->super_path)._M_pathname._M_dataplus._M_p;
    local_38 = &local_28;
    std::__cxx11::u8string::_M_construct<char_const*>((u8string *)&local_38,pcVar2,pcVar2 + sVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char8_t_const*,std::__cxx11::u8string>>
            ((string *)__return_storage_ptr__,local_38,local_38 + local_30);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string utf8string() const
    {
        const std::u8string& utf8_str{std::filesystem::path::u8string()};
        return std::string{utf8_str.begin(), utf8_str.end()};
    }